

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hexdumper.h
# Opt level: O3

void __thiscall Hex::Hexdumper<unsigned_short>::dump(Hexdumper<unsigned_short> *this,ostream *os)

{
  uint uVar1;
  long lVar2;
  ostream filler;
  bool bVar3;
  int iVar4;
  unsigned_short *puVar5;
  ostream *poVar6;
  long lVar7;
  uint uVar8;
  int iVar9;
  int unitsperline;
  unsigned_short *puVar10;
  unsigned_short *first;
  pair<const_unsigned_short_*,_const_unsigned_short_*> curline;
  pair<const_unsigned_short_*,_const_unsigned_short_*> local_88;
  long local_70;
  uint local_64;
  uint local_60;
  uint local_5c;
  pair<const_unsigned_short_*,_const_unsigned_short_*> local_58;
  uint64_t local_40;
  uint64_t local_38;
  
  lVar7 = *(long *)(*(long *)os + -0x18);
  poVar6 = os + lVar7;
  if (os[lVar7 + 0xe1] == (ostream)0x1) {
    filler = poVar6[0xe0];
  }
  else {
    filler = (ostream)std::ios::widen((char)poVar6);
    poVar6[0xe0] = filler;
    poVar6[0xe1] = (ostream)0x1;
    lVar7 = *(long *)(*(long *)os + -0x18);
  }
  iVar4 = *(int *)(os + lVar7 + 0x10);
  uVar1 = *(uint *)(os + lVar7 + 0x18);
  uVar8 = uVar1 & 0xb0;
  if ((uVar1 >> 10 & 1) != 0) {
    Hexdumper_base::getbaseofs(os);
  }
  local_38 = Hexdumper_base::getstep(os);
  local_40 = Hexdumper_base::getthreshold(os);
  iVar9 = 0x20;
  if ((uVar1 >> 0xb & 1) == 0) {
    iVar9 = 8;
  }
  unitsperline = 0x10;
  if (uVar8 != 0x20) {
    unitsperline = iVar9;
  }
  if (iVar4 != -1) {
    unitsperline = iVar4;
  }
  first = this->_first;
  lVar7 = *(long *)os;
  lVar2 = *(long *)(lVar7 + -0x18);
  *(uint *)(os + lVar2 + 0x18) = *(uint *)(os + lVar2 + 0x18) & 0xffffff4f | 0x80;
  *(undefined8 *)(os + *(long *)(lVar7 + -0x18) + 0x10) = 0;
  puVar5 = this->_last;
  local_58.first = first;
  local_58.second = first;
  if (first < puVar5) {
    local_5c = uVar1 & 0x4a;
    local_70 = (long)unitsperline;
    local_60 = uVar1 >> 0xe & 1;
    local_64 = uVar1 >> 9 & 1;
    do {
      puVar10 = first + local_70;
      if (puVar5 <= puVar10) {
        puVar10 = this->_last;
      }
      if (unitsperline == 0) {
        puVar10 = puVar5;
      }
      local_88.first = first;
      local_88.second = puVar10;
      if ((uVar1 >> 0xc & 1) == 0) {
LAB_00106884:
        if ((uVar1 >> 10 & 1) != 0) {
          lVar7 = *(long *)os;
          *(undefined8 *)(os + *(long *)(lVar7 + -0x18) + 0x10) = 8;
          poVar6 = os + *(long *)(lVar7 + -0x18);
          if (os[*(long *)(lVar7 + -0x18) + 0xe1] == (ostream)0x0) {
            std::ios::widen((char)poVar6);
            poVar6[0xe1] = (ostream)0x1;
            lVar7 = *(long *)os;
          }
          poVar6[0xe0] = (ostream)0x30;
          *(uint *)(os + *(long *)(lVar7 + -0x18) + 0x18) =
               *(uint *)(os + *(long *)(lVar7 + -0x18) + 0x18) & 0xffffffb5 | 8;
          poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)os);
          std::__ostream_insert<char,std::char_traits<char>>(poVar6,": ",2);
        }
        if ((uVar1 >> 0xb & 1) == 0) {
          output_hex(os,local_88.first,local_88.second,(char)filler,local_5c,SUB41(local_64,0),
                     SUB41(local_60,0));
          if ((unitsperline != 0) && (lVar7 = (long)puVar10 - (long)first >> 1, lVar7 != local_70))
          {
            output_padding(os,unitsperline - (int)lVar7,(char)filler);
          }
          if (uVar8 != 0x20) {
            std::__ostream_insert<char,std::char_traits<char>>(os,"  ",2);
            goto LAB_0010697c;
          }
LAB_00106976:
          if (unitsperline == 0) goto LAB_001069c2;
        }
        else {
          if (uVar8 == 0x20) goto LAB_00106976;
LAB_0010697c:
          output_asc(os,local_88.first,local_88.second);
          if (unitsperline == 0) goto LAB_001069c2;
          lVar7 = (long)puVar10 - (long)first >> 1;
          if (lVar7 != local_70) {
            output_asc_padding(os,unitsperline - (int)lVar7);
          }
        }
        std::__ostream_insert<char,std::char_traits<char>>(os,"\n",1);
      }
      else {
        bVar3 = data_is_equal<std::pair<unsigned_short_const*,unsigned_short_const*>>
                          (&local_58,&local_88);
        if (!bVar3) {
          local_58.first = local_88.first;
          local_58.second = local_88.second;
          goto LAB_00106884;
        }
        iVar4 = count_identical_lines(first,this->_last,unitsperline);
        if (iVar4 <= (int)local_40) goto LAB_00106884;
        std::__ostream_insert<char,std::char_traits<char>>(os,"* [ 0x",6);
        *(uint *)(os + *(long *)(*(long *)os + -0x18) + 0x18) =
             *(uint *)(os + *(long *)(*(long *)os + -0x18) + 0x18) & 0xffffffb5 | 8;
        poVar6 = (ostream *)std::ostream::operator<<((ostream *)os,iVar4);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6," lines ]\n",9);
        puVar10 = first + iVar4 * unitsperline;
      }
LAB_001069c2:
      puVar5 = first + local_38;
      first = puVar10;
      if (local_38 != 0) {
        first = puVar5;
      }
      puVar5 = this->_last;
    } while (first < puVar5);
  }
  Hexdumper_base::clearflags(os);
  return;
}

Assistant:

void dump(std::ostream& os) const
    {
        // make copy of current 'os' settings
        char filler = os.fill();  // what to output between hex numbers.
        int unitsperline = os.width();  // when not set: everything on one line
        // upl == 0 -> everything on one line
        // upl ==-1 -> unspecified -> use defaults
        //int unitwidth = os.precision(); // NOT USED (yet)
        int adjust = os.flags() & os.adjustfield;
        int numberbase = os.flags() & os.basefield;

        bool showbase = os.flags() & os.showbase;
        bool showpos = os.flags() & os.showpos;
        bool showoffset = os.flags() & os.showpoint;
        bool uppercasehex = os.flags() & os.uppercase;
        bool summarize = os.flags() & os.skipws;

        uint64_t ofs = showoffset ? getbaseofs(os) : 0;
        uint64_t step = getstep(os);

        int threshold = getthreshold(os);

        // showpos adjust
        //   yes     left    %+-b     ...    invalid
        //   yes     right   %+b     asc only
        //   no      left    %-b     hex only
        //   no      right   %b      hex + asc

        if (unitsperline==-1) {
            if (adjust == os.left)
                unitsperline = 32 / sizeof(T);
            else if (showpos)
                unitsperline = 64 / sizeof(T);
            else
                unitsperline = 16 / sizeof(T);
        }

        auto p = _first;

        //auto prevp = p;
        auto prevline = std::make_pair(p, p);

        os << std::right;
        os.width(0);
        while (p < _last) {
            auto pend = unitsperline ? std::min(_last, p+unitsperline) : _last;
            auto curline = std::make_pair(p, pend);
            if (summarize) {
                if (data_is_equal(prevline, curline)) {
                    int count = count_identical_lines(p, _last, unitsperline);
                    if (count > threshold) {
                        os << "* [ 0x" << std::hex << count << " lines ]\n";
                        pend = p + count * unitsperline;

                        goto next;
                    }
                }
                else {
                    prevline = curline;
                }
            }

            if (showoffset)
                os << std::setw(8) << std::setfill('0') << std::hex << ofs << ": ";
            if (!showpos) {
                output_hex(os, curline.first, curline.second, filler, numberbase, showbase, uppercasehex);
                if (unitsperline && pend-p != unitsperline)
                    output_padding(os, unitsperline-(pend-p), filler);
            }

            if (!showpos && adjust != os.left)
                os << "  ";   // separate left from right
            if (adjust != os.left)
            {
                output_asc(os, curline.first, curline.second);
                if (unitsperline && pend-p != unitsperline)
                    output_asc_padding(os, unitsperline-(pend-p));
            }

            if (unitsperline)
                os << "\n";

        next:
            if (step) {
                ofs += step;
                p += step;
            }
            else {
                ofs += sizeof(T) * (pend-p);
                p = pend;
            }
        }
        clearflags(os);
    }